

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::on_resume_data_checked(torrent *this,status_t status,storage_error *error)

{
  int *piVar1;
  undefined1 *puVar2;
  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
  *this_00;
  uint *puVar3;
  uchar uVar4;
  add_torrent_params *paVar5;
  pointer pbVar6;
  peer_list *ppVar7;
  _Map_pointer ppptVar8;
  error_category *peVar9;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> _Var10;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> uVar11;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_01;
  tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_> tVar12;
  uint3 uVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  _Rb_tree_color _Var17;
  _Rb_tree_color _Var18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  torrent_peer *tp;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar19;
  undefined4 extraout_var_03;
  _Rb_tree_node_base *p_Var20;
  uint uVar21;
  piece_index_t pVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  basic_endpoint<boost::asio::ip::tcp> *p;
  endpoint *peVar26;
  piece_block block;
  pointer pbVar27;
  bool bVar28;
  string_view job_name;
  string str;
  string local_90;
  undefined1 local_70 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  anon_union_16_3_a3f0114d_for___in6_u local_48;
  pointer local_38;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    uVar4 = (this->m_need_save_resume_data).m_val;
    if (((status.m_val & 8) != 0) &&
       (iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])(),
       (*(uint *)(CONCAT44(extraout_var,iVar15) + 0x68) & 8) != 0)) {
      iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)local_70);
      alert_manager::emplace_alert<libtorrent::oversized_file_alert,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar15),(torrent_handle *)local_70);
      if ((tuple<libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_70._8_8_ != (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_70._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          iVar15 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar15 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_70._8_8_)->
                                   super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                   ).
                                   super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 4);
          *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_70._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar15 + -1;
        }
        if (iVar15 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)local_70._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
    }
    if ((status.m_val & 1) != 0) {
      job_name._M_str = "check_resume_data";
      job_name._M_len = 0x11;
      handle_disk_error(this,job_name,error,(peer_connection *)0x0,none);
      auto_managed(this,false);
      pause(this);
    }
    state_updated(this);
    this_00 = &this->m_add_torrent_params;
    paVar5 = (this->m_add_torrent_params)._M_t.
             super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
             .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
    if (paVar5 != (add_torrent_params *)0x0) {
      pbVar27 = (paVar5->peers).
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (peVar26 = *(endpoint **)
                      &(paVar5->peers).
                       super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                       ._M_impl; peVar26 != pbVar27; peVar26 = peVar26 + 1) {
        add_peer(this,peVar26,(peer_source_flags_t)0x10,(pex_flags_t)0x0);
      }
      iVar15 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      if ((char)iVar15 != '\0') {
        paVar5 = (this_00->_M_t).
                 super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                 .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
        pbVar27 = *(pointer *)
                   &(paVar5->peers).
                    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                    ._M_impl;
        pbVar6 = (paVar5->peers).
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar27 != pbVar6) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          local_90._M_string_length = 0;
          local_90.field_2._M_local_buf[0] = '\0';
          do {
            if (*(short *)&(pbVar27->impl_).data_ == 2) {
              local_50._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((ulong)(pbVar27->impl_).data_.v6.sin6_flowinfo << 0x20);
              local_48._0_8_ = 0;
              local_48._8_8_ = (session_interface *)0x0;
              local_38 = (pointer)0x0;
            }
            else {
              local_48._0_8_ = *(int64_t *)((long)&(pbVar27->impl_).data_ + 8);
              local_48._8_8_ = *(undefined8 *)((long)&(pbVar27->impl_).data_ + 0x10);
              local_38 = (pointer)(ulong)(pbVar27->impl_).data_.v6.sin6_scope_id;
              local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
            }
            boost::asio::ip::address::to_string_abi_cxx11_((string *)local_70,(address *)&local_50);
            ::std::__cxx11::string::_M_append((char *)&local_90,local_70._0_8_);
            if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
              operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
            }
            ::std::__cxx11::string::push_back((char)&local_90);
            pbVar27 = pbVar27 + 1;
          } while (pbVar27 != pbVar6);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"resume-checked add_peer() [ %s] connect-candidates: %d",
                     local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,
                            CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                     local_90.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      paVar5 = (this_00->_M_t).
               super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
               .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      pbVar27 = (paVar5->banned_peers).
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (peVar26 = *(endpoint **)
                      &(paVar5->banned_peers).
                       super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                       ._M_impl; peVar26 != pbVar27; peVar26 = peVar26 + 1) {
        tp = add_peer(this,peVar26,(peer_source_flags_t)0x10,(pex_flags_t)0x0);
        if (tp != (torrent_peer *)0x0) {
          ban_peer(this,tp);
        }
      }
      paVar5 = (this_00->_M_t).
               super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
               .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      if ((*(pointer *)
            &(paVar5->peers).
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ._M_impl !=
           (paVar5->peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (*(pointer *)
           &(paVar5->banned_peers).
            super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
            ._M_impl !=
          (paVar5->banned_peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        update_want_peers(this);
      }
      ppVar7 = (this->super_torrent_hot_members).m_peer_list._M_t.
               super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
               .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
      if ((ppVar7 != (peer_list *)0x0) &&
         (ppptVar8 = (ppVar7->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,
         0 < (int)((int)((ulong)((long)(ppVar7->m_peers).
                                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                       .
                                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_last -
                                (long)(ppVar7->m_peers).
                                      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                      .
                                      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
                   (int)((ulong)((long)(ppVar7->m_peers).
                                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                       .
                                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                (long)(ppVar7->m_peers).
                                      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                      .
                                      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
                  ((((uint)((int)ppptVar8 -
                           *(int *)&(ppVar7->m_peers).
                                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                    .
                                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                  (uint)(ppptVar8 == (_Map_pointer)0x0)) * 0x40))) {
        (*(this->super_request_callback)._vptr_request_callback[7])(this);
      }
    }
    bVar28 = (status.m_val & 7) != 0;
    if ((((bVar28) || ((error->ec).val_ != 0)) &&
        (paVar5 = (this_00->_M_t).
                  super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                  .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl,
        paVar5 != (add_torrent_params *)0x0)) &&
       ((bVar14 = contains_resume_data(paVar5), bVar14 &&
        (iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])(),
        (*(uint *)(CONCAT44(extraout_var_01,iVar15) + 0x68) & 0x41) != 0)))) {
      iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)local_70);
      resolve_filename_abi_cxx11_(&local_90,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
      alert_manager::
      emplace_alert<libtorrent::fastresume_rejected_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar15),(torrent_handle *)local_70,
                 &error->ec,&local_90,&error->operation);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if ((piece_picker *)local_70._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_70._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          iVar15 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar15 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_70._8_8_)->
                                   super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                   ).
                                   super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 4);
          *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_70._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar15 + -1;
        }
        if (iVar15 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)local_70._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
    }
    iVar15 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar15 != '\0') {
      if (((status.m_val & 7) == 0) && ((error->ec).val_ == 0)) {
        (*(this->super_request_callback)._vptr_request_callback[7])(this);
      }
      else {
        uVar23 = (error->ec).val_;
        pcVar19 = operation_name(error->operation);
        uVar13 = *(uint3 *)&error->field_0x10;
        peVar9 = (error->ec).cat_;
        (*peVar9->_vptr_error_category[4])(&local_90,peVar9,(ulong)(uint)(error->ec).val_);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"fastresume data rejected: ret: %d (%d) op: %s file: %d %s",
                   (ulong)status.m_val,(ulong)uVar23,pcVar19,
                   (ulong)(uint)((int)((uint)uVar13 << 8) >> 8),local_90._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    if (((((status.m_val & 7) == 0) &&
         (paVar5 = (this_00->_M_t).
                   super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                   .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl,
         paVar5 != (add_torrent_params *)0x0)) &&
        (_Var10._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
              *(tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_> *)
               &(paVar5->have_pieces).super_bitfield.m_buf,
        (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
        _Var10._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl !=
        (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0)) &&
       (*(int *)_Var10._M_t.
                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != 0)) {
      if ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>)
          _Var10._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
          super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>)0x0) {
        iVar15 = 0;
      }
      else {
        iVar15 = *(int *)_Var10._M_t.
                         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                         .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      }
      if (iVar15 < (((this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_num_pieces) {
        if ((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
            _Var10._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
            .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
          iVar15 = 0;
        }
        else {
          iVar15 = *(int *)_Var10._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
        }
        (this->m_num_checked_pieces).m_val = iVar15;
        (this->m_checking_piece).m_val = iVar15;
        bVar28 = true;
      }
    }
    if ((status.m_val & 7) == 0) {
      if ((this->field_0x5cc & 4) == 0) {
        if (((error->ec).val_ == 0) &&
           (paVar5 = (this_00->_M_t).
                     super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                     .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl,
           paVar5 != (add_torrent_params *)0x0)) {
          uVar11._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
          .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
          super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
               *(__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true> *)
                &(paVar5->have_pieces).super_bitfield.m_buf;
          if ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
              uVar11._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
              _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl ==
              (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0) {
            iVar15 = 0;
          }
          else {
            iVar15 = *(int *)uVar11._M_t.
                             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                             .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
          }
          iVar16 = (((this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_num_pieces;
          if (iVar16 < iVar15) {
            iVar15 = iVar16;
          }
          if (0 < iVar15) {
            pVar22.m_val = 0;
            do {
              uVar23 = 0x80000000 >> ((byte)pVar22.m_val & 0x1f);
              if ((*(uint *)((long)(((this_00->_M_t).
                                     super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                                     .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>
                                    ._M_head_impl)->have_pieces).super_bitfield.m_buf + 4 +
                            (ulong)((uint)pVar22.m_val >> 5) * 4) &
                  (uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                  uVar23 << 0x18)) != 0) {
                need_picker(this);
                piece_picker::we_have
                          ((this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl,pVar22);
                iVar16 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                           _vptr_session_logger[0x4b])();
                counters::inc_stats_counter((counters *)CONCAT44(extraout_var_03,iVar16),0x6b,1);
                update_gauge(this);
                we_have(this,pVar22,true);
              }
              pVar22.m_val = pVar22.m_val + 1;
            } while (iVar15 != pVar22.m_val);
          }
          _Var17 = file_storage::blocks_per_piece
                             (&((this->super_torrent_hot_members).m_torrent_file.
                                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_files);
          paVar5 = (this_00->_M_t).
                   super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                   .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
          for (p_Var20 = (paVar5->unfinished_pieces).
                         super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                         ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var20 !=
              &(paVar5->unfinished_pieces).
               super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
               ._M_t._M_impl.super__Rb_tree_header;
              p_Var20 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var20)) {
            pVar22.m_val = p_Var20[1]._M_color;
            block.block_index = 0;
            block.piece_index.m_val = pVar22.m_val;
            if ((-1 < pVar22.m_val) &&
               (pVar22.m_val <
                (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_num_pieces)) {
              if ((this->field_0x5cc & 4) != 0) {
                leave_seed_mode(this,skip_checking);
              }
              this_01._M_head_impl =
                   (this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
              if ((this_01._M_head_impl != (piece_picker *)0x0) &&
                 (bVar14 = piece_picker::have_piece(this_01._M_head_impl,pVar22), bVar14)) {
                piece_picker::we_dont_have
                          ((this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl,pVar22);
                update_gauge(this);
              }
              need_picker(this);
              if (p_Var20[1]._M_parent == (_Base_ptr)0x0) {
                _Var18 = _S_red;
              }
              else {
                _Var18 = (p_Var20[1]._M_parent)->_M_color;
              }
              if ((int)_Var17 <= (int)_Var18) {
                _Var18 = _Var17;
              }
              if (0 < (int)_Var18) {
                uVar25 = 0;
                do {
                  uVar23 = 0x80000000 >> ((byte)uVar25 & 0x1f);
                  if ((*(uint *)(&(p_Var20[1]._M_parent)->field_0x4 + (uVar25 >> 5 & 0x7ffffff) * 4)
                      & (uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                        uVar23 << 0x18)) != 0) {
                    piece_picker::mark_as_finished
                              ((this->super_torrent_hot_members).m_picker._M_t.
                               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                               _M_head_impl,block,(torrent_peer *)0x0);
                  }
                  uVar25 = uVar25 + 1;
                  block = (piece_block)((long)block + 0x100000000);
                } while (_Var18 != uVar25);
              }
              bVar14 = piece_picker::is_piece_finished
                                 ((this->super_torrent_hot_members).m_picker._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                  _M_head_impl,pVar22);
              if (bVar14) {
                verify_piece(this,pVar22);
              }
            }
          }
        }
      }
      else {
        puVar2 = &(this->super_torrent_hot_members).field_0x4b;
        *puVar2 = *puVar2 | 0x40;
        update_gauge(this);
        update_state_list(this);
        if (((error->ec).val_ == 0) &&
           (paVar5 = (this_00->_M_t).
                     super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                     .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl,
           paVar5 != (add_torrent_params *)0x0)) {
          uVar11._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
          .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
          super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
               *(__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true> *)
                &(paVar5->verified_pieces).super_bitfield.m_buf;
          if ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
              uVar11._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
              _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl ==
              (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0) {
            uVar23 = 0;
          }
          else {
            uVar23 = *(uint *)uVar11._M_t.
                              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                              .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
          }
          uVar21 = (((this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_num_pieces;
          if ((int)uVar21 < (int)uVar23) {
            uVar23 = uVar21;
          }
          if (0 < (int)uVar23) {
            tVar12.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                 (this->m_verified).super_bitfield.m_buf.
                 super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
            uVar21 = 0;
            do {
              uVar24 = 0x80000000 >> ((byte)uVar21 & 0x1f);
              uVar24 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                       uVar24 << 0x18;
              if ((*(uint *)((long)uVar11._M_t.
                                   super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                   .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                            ((ulong)(uVar21 >> 5) + 1) * 4) & uVar24) != 0) {
                puVar3 = (uint *)((long)tVar12.
                                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                        .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                                  4 + (ulong)(uVar21 >> 5) * 4);
                *puVar3 = *puVar3 | uVar24;
              }
              uVar21 = uVar21 + 1;
            } while (uVar23 != uVar21);
          }
        }
      }
    }
    else {
      this->field_0x5cc = this->field_0x5cc & 0xfb;
      puVar2 = &(this->super_torrent_hot_members).field_0x4b;
      *puVar2 = *puVar2 & 0xbf;
      update_gauge(this);
      update_state_list(this);
    }
    if (bVar28) {
      stop_announcing(this);
      set_state(this,checking_files);
      uVar25 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
      if ((((uVar25 & 0xe00000008000000) == 0x200000000000000) && ((uVar25 & 0x14000000) == 0)) &&
         ((this->m_error).failed_ == false)) {
        start_checking(this);
      }
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c]
      )();
    }
    else {
      files_checked(this);
    }
    maybe_done_flushing(this);
    ::std::
    __uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
    ::reset((__uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
             *)this_00,(pointer)0x0);
    (this->m_need_save_resume_data).m_val = uVar4;
  }
  return;
}

Assistant:

void torrent::on_resume_data_checked(status_t const status
		, storage_error const& error) try
	{
#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(m_outstanding_check_files);
		m_outstanding_check_files = false;
#endif

		// when applying some of the resume data to the torrent, we will
		// trigger calls that set m_need_save_resume_data, even though we're
		// just applying the state of the resume data we loaded with. We don't
		// want anything in this function to affect the state of
		// m_need_save_resume_data, so we save it in a local variable and reset
		// it at the end of the function.
		auto const need_save_resume_data = m_need_save_resume_data;

		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;

		if (status & disk_status::oversized_file)
		{
			if (m_ses.alerts().should_post<oversized_file_alert>())
				m_ses.alerts().emplace_alert<oversized_file_alert>(get_handle());
		}

		if (status & disk_status::fatal_disk_error)
		{
			TORRENT_ASSERT(m_outstanding_check_files == false);
			handle_disk_error("check_resume_data", error);
			auto_managed(false);
			pause();
		}

		state_updated();

		if (m_add_torrent_params)
		{
			// --- PEERS ---

			for (auto const& p : m_add_torrent_params->peers)
			{
				add_peer(p , peer_info::resume_data);
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log() && !m_add_torrent_params->peers.empty())
			{
				std::string str;
				for (auto const& peer : m_add_torrent_params->peers)
				{
					str += peer.address().to_string();
					str += ' ';
				}
				debug_log("resume-checked add_peer() [ %s] connect-candidates: %d"
					, str.c_str(), m_peer_list
					? m_peer_list->num_connect_candidates() : -1);
			}
#endif

			for (auto const& p : m_add_torrent_params->banned_peers)
			{
				torrent_peer* peer = add_peer(p, peer_info::resume_data);
				if (peer) ban_peer(peer);
			}

			if (!m_add_torrent_params->peers.empty()
				|| !m_add_torrent_params->banned_peers.empty())
			{
				update_want_peers();
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (m_peer_list && m_peer_list->num_peers() > 0)
				debug_log("resume added peers (total peers: %d)"
					, m_peer_list->num_peers());
#endif
		}

		bool const has_error_status
			= (status & disk_status::fatal_disk_error)
			|| (status & disk_status::need_full_check)
			|| (status & disk_status::file_exist);

		// only report this error if the user actually provided resume data
		// (i.e. m_add_torrent_params->have_pieces)
		if ((error || has_error_status)
			&& m_add_torrent_params
			&& aux::contains_resume_data(*m_add_torrent_params)
			&& m_ses.alerts().should_post<fastresume_rejected_alert>())
		{
			m_ses.alerts().emplace_alert<fastresume_rejected_alert>(get_handle()
				, error.ec
				, resolve_filename(error.file())
				, error.operation);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			if (has_error_status || error)
			{
				debug_log("fastresume data rejected: ret: %d (%d) op: %s file: %d %s"
					, int(static_cast<std::uint8_t>(status)), error.ec.value()
					, operation_name(error.operation)
					, static_cast<int>(error.file())
					, error.ec.message().c_str());
			}
			else
			{
				debug_log("fastresume data accepted");
			}
		}
#endif

		bool should_start_full_check = has_error_status;

		// if we got a partial pieces bitfield, it means we were in the middle of
		// checking this torrent. pick it up where we left off
		if (!has_error_status
			&& m_add_torrent_params
			&& !m_add_torrent_params->have_pieces.empty()
			&& m_add_torrent_params->have_pieces.size() < m_torrent_file->num_pieces())
		{
			m_checking_piece = m_num_checked_pieces
				= m_add_torrent_params->have_pieces.end_index();
			should_start_full_check = true;
		}

		// if ret != 0, it means we need a full check. We don't necessarily need
		// that when the resume data check fails. For instance, if the resume data
		// is incorrect, but we don't have any files, we skip the check and initialize
		// the storage to not have anything.
		if (!has_error_status)
		{
			// there are either no files for this torrent
			// or the resume_data was accepted

			if (m_seed_mode)
			{
				m_have_all = true;
				update_gauge();
				update_state_list();

				if (!error && m_add_torrent_params)
				{
					int const num_pieces2 = std::min(m_add_torrent_params->verified_pieces.size()
						, torrent_file().num_pieces());
					for (piece_index_t i{0}; i < piece_index_t(num_pieces2); ++i)
					{
						if (!m_add_torrent_params->verified_pieces[i]) continue;
						m_verified.set_bit(i);
					}
				}
			}
			else if (!error && m_add_torrent_params)
			{
				// --- PIECES ---

				int const num_pieces = std::min(m_add_torrent_params->have_pieces.size()
					, torrent_file().num_pieces());
				for (piece_index_t i{0}; i < piece_index_t(num_pieces); ++i)
				{
					if (!m_add_torrent_params->have_pieces[i]) continue;
					need_picker();
					m_picker->we_have(i);
					inc_stats_counter(counters::num_piece_passed);
					update_gauge();
					we_have(i, true);
				}

				// --- UNFINISHED PIECES ---

				int const num_blocks_per_piece = torrent_file().blocks_per_piece();

				for (auto const& p : m_add_torrent_params->unfinished_pieces)
				{
					piece_index_t const piece = p.first;
					bitfield const& blocks = p.second;

					if (piece < piece_index_t(0) || piece >= torrent_file().end_piece())
					{
						continue;
					}

					// being in seed mode and missing a piece is not compatible.
					// Leave seed mode if that happens
					if (m_seed_mode) leave_seed_mode(seed_mode_t::skip_checking);

					if (has_picker() && m_picker->have_piece(piece))
					{
						m_picker->we_dont_have(piece);
						update_gauge();
					}

					need_picker();

					const int num_bits = std::min(num_blocks_per_piece, int(blocks.size()));
					for (int k = 0; k < num_bits; ++k)
					{
						if (blocks.get_bit(k))
						{
							m_picker->mark_as_finished(piece_block(piece, k), nullptr);
						}
					}
					if (m_picker->is_piece_finished(piece))
					{
						verify_piece(piece);
					}
				}
			}
		}
		else
		{
			m_seed_mode = false;
			// either the fastresume data was rejected or there are
			// some files
			m_have_all = false;
			update_gauge();
			update_state_list();
		}

		if (should_start_full_check)
		{
			stop_announcing();
			set_state(torrent_status::checking_files);
			if (should_check_files()) start_checking();

			// start the checking right away (potentially)
			m_ses.trigger_auto_manage();
		}
		else
		{
			files_checked();
		}

		// this will remove the piece picker, if we're done with it
		maybe_done_flushing();
		TORRENT_ASSERT(m_outstanding_check_files == false);
		m_add_torrent_params.reset();

		// restore m_need_save_resume_data to its state when we entered this
		// function.
		m_need_save_resume_data = need_save_resume_data;
	}
	catch (...) { handle_exception(); }